

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall
duckdb_shell::ModeBoxRenderer::RenderHeader(ModeBoxRenderer *this,ColumnarResult *result)

{
  ulong *in_RSI;
  ColumnarResult *in_RDI;
  ModeBoxRenderer *unaff_retaddr;
  idx_t i;
  char *in_stack_ffffffffffffffc8;
  ShellState *in_stack_ffffffffffffffd0;
  char *this_00;
  pointer in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe8;
  char *zSep2;
  ColumnarResult *result_00;
  
  result_00 = in_RDI;
  print_box_row_separator
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(char *)in_RSI,in_stack_ffffffffffffffe8,
             (char *)in_RDI,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd8);
  ShellState::Print(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (zSep2 = (char *)0x0; zSep2 < (char *)*in_RSI; zSep2 = zSep2 + 1) {
    ColumnRenderer::RenderAlignedValue(&unaff_retaddr->super_ColumnRenderer,result_00,(idx_t)in_RSI)
    ;
    in_stack_ffffffffffffffd8 =
         (in_RDI->data).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (zSep2 == (char *)(*in_RSI - 1)) {
      this_00 = anon_var_dwarf_13e55;
    }
    else {
      this_00 = anon_var_dwarf_13e6b;
    }
    ShellState::Print((ShellState *)this_00,in_stack_ffffffffffffffc8);
  }
  print_box_row_separator
            (unaff_retaddr,(int)((ulong)result_00 >> 0x20),(char *)in_RSI,zSep2,(char *)in_RDI,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void RenderHeader(ColumnarResult &result) override {
		print_box_row_separator(result.column_count, BOX_23, BOX_234, BOX_34, result.column_width);
		state.Print(BOX_13 " ");
		for (idx_t i = 0; i < result.column_count; i++) {
			RenderAlignedValue(result, i);
			state.Print(i == result.column_count - 1 ? " " BOX_13 "\n" : " " BOX_13 " ");
		}
		print_box_row_separator(result.column_count, BOX_123, BOX_1234, BOX_134, result.column_width);
	}